

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

int __thiscall despot::BaseRockSample::NextState(BaseRockSample *this,int s,ACT_TYPE a)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int local_58;
  undefined8 uStack_40;
  int rock;
  Coord rob_pos_1;
  int next;
  int iStack_28;
  int next_pos;
  Coord rob_pos;
  ACT_TYPE a_local;
  int s_local;
  BaseRockSample *this_local;
  
  _rob_pos = a;
  iVar2 = (**(code **)(*(long *)this + 0x10))();
  if (s == iVar2 + -1) {
    iVar2 = (**(code **)(*(long *)this + 0x10))();
    this_local._4_4_ = iVar2 + -1;
  }
  else {
    _iStack_28 = IndexToCoord(this,s >> ((byte)this->num_rocks_ & 0x1f));
    if (_rob_pos < 4) {
      despot::operator+=((Coord *)&stack0xffffffffffffffd8,
                         (Coord *)(&Compass::DIRECTIONS + _rob_pos));
      bVar1 = Grid<int>::Inside(&this->grid_,(Coord *)&stack0xffffffffffffffd8);
      if (bVar1) {
        iVar2 = CoordToIndex(this,_iStack_28);
        this_local._4_4_ =
             s + (iVar2 - (s >> ((byte)this->num_rocks_ & 0x1f)) << ((byte)this->num_rocks_ & 0x1f))
        ;
      }
      else {
        iVar2 = iStack_28;
        iVar3 = Grid<int>::xsize(&this->grid_);
        local_58 = s;
        if (iVar2 == iVar3) {
          local_58 = (**(code **)(*(long *)this + 0x10))();
          local_58 = local_58 + -1;
        }
        this_local._4_4_ = local_58;
      }
    }
    else {
      this_local._4_4_ = s;
      if (_rob_pos == 4) {
        _rob_pos_1 = s;
        uStack_40 = IndexToCoord(this,s >> ((byte)this->num_rocks_ & 0x1f));
        piVar4 = Grid<int>::operator()(&this->grid_,(Coord *)&stack0xffffffffffffffc0);
        if (-1 < *piVar4) {
          UnsetFlag((int *)&rob_pos_1,*piVar4);
        }
        this_local._4_4_ = _rob_pos_1;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int BaseRockSample::NextState(int s, ACT_TYPE a) const {
	if (s == NumStates() - 1)
		return NumStates() - 1;

	Coord rob_pos = IndexToCoord(s >> num_rocks_);
	if (a < E_SAMPLE) {
		rob_pos += Compass::DIRECTIONS[a];
		if (grid_.Inside(rob_pos)) {
			int next_pos = CoordToIndex(rob_pos);
			return s + ((next_pos - (s >> num_rocks_)) << num_rocks_);
		} else {
			return rob_pos.x == grid_.xsize() ? (NumStates() - 1) : s;
		}
	} else if (a == E_SAMPLE) {
		int next = s;
		Coord rob_pos = IndexToCoord(s >> num_rocks_);
		int rock = grid_(rob_pos);
		if (rock >= 0)
			UnsetFlag(next, rock);
		return next;
	} else
		return s;
}